

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  float fVar1;
  ma_result in_EAX;
  ma_uint64 mVar2;
  int iVar3;
  
  if (pConverter->channelsIn != 2) {
    __assert_fail("pConverter->channelsIn == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85cf,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->channelsOut != 1) {
    __assert_fail("pConverter->channelsOut == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85d0,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->format == ma_format_s16) {
    if (frameCount != 0) {
      mVar2 = 0;
      do {
        iVar3 = (int)*(short *)((long)pFramesIn + mVar2 * 4 + 2) +
                (int)*(short *)((long)pFramesIn + mVar2 * 4);
        *(short *)((long)pFramesOut + mVar2 * 2) = (short)((uint)(iVar3 - (iVar3 >> 0x1f)) >> 1);
        mVar2 = mVar2 + 1;
      } while (frameCount != mVar2);
    }
  }
  else if (frameCount != 0) {
    mVar2 = 0;
    do {
      fVar1 = *(float *)((long)pFramesIn + mVar2 * 8);
      *(float *)((long)pFramesOut + mVar2 * 4) = (fVar1 + fVar1) * 0.5;
      mVar2 = mVar2 + 1;
    } while (frameCount != mVar2);
  }
  return in_EAX;
}

Assistant:

static ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint64 iFrame;

    MA_ASSERT(pConverter != NULL);
    MA_ASSERT(pFramesOut != NULL);
    MA_ASSERT(pFramesIn  != NULL);
    MA_ASSERT(pConverter->channelsIn  == 2);
    MA_ASSERT(pConverter->channelsOut == 1);

    if (pConverter->format == ma_format_s16) {
        /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
        const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

        for (iFrame = 0; iFrame < frameCount; ++iFrame) {
            pFramesOutS16[iFrame] = (ma_int16)(((ma_int32)pFramesInS16[iFrame*2+0] + (ma_int32)pFramesInS16[iFrame*2+1]) / 2);
        }
    } else {
        /* */ float* pFramesOutF32 = (      float*)pFramesOut;
        const float* pFramesInF32  = (const float*)pFramesIn;

        for (iFrame = 0; iFrame < frameCount; ++iFrame) {
            pFramesOutF32[iFrame] = (pFramesInF32[iFrame*2+0] + pFramesInF32[iFrame*2+0]) * 0.5f;
        }
    }

    return MA_SUCCESS;
}